

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenChain.h
# Opt level: O0

void __thiscall
adios2::shm::TokenChain<unsigned_long>::TokenChain(TokenChain<unsigned_long> *this,Comm *comm)

{
  int iVar1;
  void *pvVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int disp_unit;
  size_t shmsize;
  char *ptr;
  Win *in_stack_fffffffffffffef8;
  Win *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  string *this_00;
  undefined8 in_stack_ffffffffffffff18;
  int disp_unit_00;
  Win *win;
  size_t in_stack_ffffffffffffff20;
  Comm *pCVar3;
  Comm *in_stack_ffffffffffffff28;
  string *hint;
  string local_a8 [48];
  string local_78;
  string local_40 [40];
  undefined8 local_18;
  
  disp_unit_00 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  *in_RDI = in_RSI;
  iVar1 = helper::Comm::Rank((Comm *)0xa9c4fc);
  *(int *)(in_RDI + 1) = iVar1;
  iVar1 = helper::Comm::Size((Comm *)0xa9c513);
  *(int *)((long)in_RDI + 0xc) = iVar1;
  helper::Comm::Win::Win((Win *)0xa9c529);
  if (*(int *)((long)in_RDI + 0xc) < 2) {
    pvVar2 = operator_new(0x10);
    in_RDI[3] = pvVar2;
    *(undefined4 *)in_RDI[3] = 0;
    *(undefined8 *)(in_RDI[3] + 8) = 0;
  }
  else {
    if (*(int *)(in_RDI + 1) == 0) {
      std::__cxx11::string::string(local_40);
      helper::Comm::Win_allocate_shared
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,disp_unit_00,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      helper::Comm::Win::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      helper::Comm::Win::~Win((Win *)0xa9c5b6);
      std::__cxx11::string::~string(local_40);
    }
    else {
      pCVar3 = (Comm *)*in_RDI;
      hint = &local_78;
      std::__cxx11::string::string((string *)hint);
      helper::Comm::Win_allocate_shared
                (pCVar3,in_stack_ffffffffffffff20,disp_unit_00,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      helper::Comm::Win::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      helper::Comm::Win::~Win((Win *)0xa9c67f);
      std::__cxx11::string::~string((string *)&local_78);
      win = (Win *)*in_RDI;
      pCVar3 = (Comm *)(in_RDI + 2);
      this_00 = local_a8;
      std::__cxx11::string::string(this_00);
      helper::Comm::Win_shared_query
                (pCVar3,win,(int)((ulong)this_00 >> 0x20),(size_t *)in_stack_ffffffffffffff08,
                 (int *)in_stack_ffffffffffffff00,this_00,hint);
      std::__cxx11::string::~string(local_a8);
    }
    in_RDI[3] = local_18;
    if (*(int *)(in_RDI + 1) == 0) {
      *(undefined4 *)in_RDI[3] = 0;
      *(undefined8 *)(in_RDI[3] + 8) = 0;
    }
  }
  return;
}

Assistant:

TokenChain(helper::Comm *comm) : m_NodeComm(comm), m_Rank(comm->Rank()), m_nProc(comm->Size())
    {
        if (m_nProc > 1)
        {
            char *ptr;
            if (!m_Rank)
            {
                m_Win = m_NodeComm->Win_allocate_shared(sizeof(segment_), 1, &ptr);
            }
            else
            {
                m_Win = m_NodeComm->Win_allocate_shared(0, 1, &ptr);
                size_t shmsize;
                int disp_unit;
                m_NodeComm->Win_shared_query(m_Win, 0, &shmsize, &disp_unit, &ptr);
            }
            m_Shm = reinterpret_cast<segment_ *>(ptr);

            if (!m_Rank)
            {
                m_Shm->currentRank = 0;
                m_Shm->token = T();
            }
        }
        else
        {
            m_Shm = new segment_;
            m_Shm->currentRank = 0;
            m_Shm->token = T();
        }
    }